

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O1

int Abc_FlowRetime_RefineConstraints(void)

{
  Abc_Ntk_t *pNtk;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  MinRegMan_t *pMVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  
  pNtk = pManMR->pNtk;
  if (pManMR->fVerbose != 0) {
    printf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n",
           (ulong)(uint)pManMR->subIteration,(ulong)(uint)pManMR->nConservConstraints,
           (ulong)(uint)pManMR->nExactConstraints);
  }
  pMVar3 = pManMR;
  pManMR->constraintMask = 0x90;
  if (pMVar3->fVerbose != 0) {
    printf("\t\trefinement: over ");
  }
  fflush(_stdout);
  Abc_FlowRetime_PushFlows(pNtk,0);
  if (pManMR->fVerbose != 0) {
    printf("= %d ");
  }
  pMVar3 = pManMR;
  pVVar5 = pNtk->vObjs;
  if (pManMR->fIsForward == 0) {
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar6];
        if ((pvVar1 != (void *)0x0) &&
           ((undefined1  [24])
            ((undefined1  [24])pMVar3->pDataArray[*(uint *)((long)pvVar1 + 0x10)] &
            (undefined1  [24])0x1) == (undefined1  [24])0x0)) {
          *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x40;
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar6 < pVVar5->nSize);
    }
  }
  else if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar6];
      if ((pvVar1 != (void *)0x0) &&
         ((undefined1  [24])
          ((undefined1  [24])pMVar3->pDataArray[*(uint *)((long)pvVar1 + 0x10)] &
          (undefined1  [24])0x2) == (undefined1  [24])0x0)) {
        *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x40;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar6 < pVVar5->nSize);
  }
  if (pMVar3->fConservTimingOnly != 0) {
    if (pMVar3->fVerbose == 0) {
      return 0;
    }
    puts(" done");
    return 0;
  }
  pMVar3->constraintMask = 0x10;
  Abc_FlowRetime_ClearFlows(0);
  if (pManMR->fVerbose != 0) {
    printf("under = ");
  }
  fflush(_stdout);
  uVar4 = Abc_FlowRetime_PushFlows(pNtk,0);
  if (pManMR->fVerbose != 0) {
    printf("%d refined nodes = ",(ulong)uVar4);
  }
  fflush(_stdout);
  pVVar5 = pNtk->vObjs;
  if (pManMR->fIsForward == 0) {
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      uVar4 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar6];
        if (pAVar2 != (Abc_Obj_t *)0x0) {
          if ((((pAVar2->field_0x14 & 0x40) != 0) &&
              ((*(ushort *)(pManMR->pDataArray + (uint)pAVar2->Id) & 1) != 0)) &&
             ((int)uVar4 < 99999 && (char)*(ushort *)(pManMR->pDataArray + (uint)pAVar2->Id) < '\0')
             ) {
            uVar4 = uVar4 + 1;
            Abc_FlowRetime_ConstrainExact(pAVar2);
          }
          pAVar2->field_0x14 = pAVar2->field_0x14 & 0xbf;
        }
        lVar6 = lVar6 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar6 < pVVar5->nSize);
      goto LAB_00461af8;
    }
  }
  else if (0 < pVVar5->nSize) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar5->pArray[lVar6];
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        if ((((pAVar2->field_0x14 & 0x40) != 0) &&
            ((*(ushort *)(pManMR->pDataArray + (uint)pAVar2->Id) & 2) != 0)) &&
           ((int)uVar4 < 99999 && (char)*(ushort *)(pManMR->pDataArray + (uint)pAVar2->Id) < '\0'))
        {
          uVar4 = uVar4 + 1;
          Abc_FlowRetime_ConstrainExact(pAVar2);
        }
        pAVar2->field_0x14 = pAVar2->field_0x14 & 0xbf;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar6 < pVVar5->nSize);
    goto LAB_00461af8;
  }
  uVar4 = 0;
LAB_00461af8:
  if (pManMR->fVerbose != 0) {
    printf("%d\n",(ulong)uVar4);
  }
  return (uint)(0 < (int)uVar4);
}

Assistant:

int Abc_FlowRetime_RefineConstraints( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  int i, flow, count = 0;
  Abc_Obj_t *pObj;
  int maxTighten = 99999;

  vprintf("\t\tsubiter %d : constraints = {cons, exact} = %d, %d\n", 
         pManMR->subIteration, pManMR->nConservConstraints, pManMR->nExactConstraints);

  // 1. overconstrained
  pManMR->constraintMask = BLOCK | CONSERVATIVE;
  vprintf("\t\trefinement: over ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("= %d ", flow);

  // remember nodes
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_R))
        pObj->fMarkC = 1;
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i )
      if (!FTEST(pObj, VISITED_E))
        pObj->fMarkC = 1;
  }

  if (pManMR->fConservTimingOnly) {
    vprintf(" done\n");
    return 0;
  }

  // 2. underconstrained
  pManMR->constraintMask = BLOCK;
  Abc_FlowRetime_ClearFlows( 0 );
  vprintf("under = ");
  fflush(stdout);
  flow = Abc_FlowRetime_PushFlows( pNtk, 0 );
  vprintf("%d refined nodes = ", flow);
  fflush(stdout);

  // find area-limiting constraints
  if (pManMR->fIsForward) {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_R) &&
          FTEST(pObj, CONSERVATIVE) && 
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  } else {
    Abc_NtkForEachObj( pNtk, pObj, i ) {
      if (pObj->fMarkC &&
          FTEST(pObj, VISITED_E) &&
          FTEST(pObj, CONSERVATIVE) &&
          count < maxTighten) {
        count++;
        Abc_FlowRetime_ConstrainExact( pObj );
      }
      pObj->fMarkC = 0;
    }
  }
  
  vprintf("%d\n", count);
  
  return (count > 0);
}